

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int clip_1d(int *x0,int *y0,int *x1,int *y1,int mindim,int maxdim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = *x0;
  if (iVar1 < mindim) {
    if (*x1 < mindim) {
      return 0;
    }
    dVar4 = (double)(*y1 - *y0) / (double)(*x1 - iVar1);
    *y0 = *y0 - (int)((double)(iVar1 - mindim) * dVar4);
    *x0 = mindim;
    if (*x1 <= maxdim) {
      return 1;
    }
    iVar3 = (int)(dVar4 * (double)(maxdim - *x1) + (double)*y1);
  }
  else {
    iVar2 = *x1;
    if (maxdim < iVar1) {
      if (maxdim < iVar2) {
        return 0;
      }
      dVar4 = (double)(*y1 - *y0) / (double)(iVar2 - iVar1);
      *y0 = (int)((double)(maxdim - iVar1) * dVar4) + *y0;
      *x0 = maxdim;
      if (mindim <= *x1) {
        return 1;
      }
      dVar4 = dVar4 * (double)(*x1 - mindim);
      iVar3 = *y1;
    }
    else {
      if (maxdim < iVar2) {
        iVar3 = (int)((double)(maxdim - iVar2) * ((double)(*y1 - *y0) / (double)(iVar2 - iVar1))) +
                *y1;
        goto LAB_0010d04c;
      }
      if (mindim <= iVar2) {
        return 1;
      }
      iVar3 = *y1;
      dVar4 = (double)(iVar2 - mindim) * ((double)(iVar3 - *y0) / (double)(iVar2 - iVar1));
    }
    iVar3 = iVar3 - (int)dVar4;
    maxdim = mindim;
  }
LAB_0010d04c:
  *y1 = iVar3;
  *x1 = maxdim;
  return 1;
}

Assistant:

static int
clip_1d (int *x0, int *y0, int *x1, int *y1, int mindim, int maxdim)
{
	double m;			/* gradient of line */
	if (*x0 < mindim) {
		/* start of line is left of window */
		if (*x1 < mindim)		/* as is the end, so the line never cuts the window */
			return 0;
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		/* adjust x0 to be on the left boundary (ie to be zero), and y0 to match */
		*y0 -= (int)(m * (*x0 - mindim));
		*x0 = mindim;
		/* now, perhaps, adjust the far end of the line as well */
		if (*x1 > maxdim) {
			*y1 += m * (maxdim - *x1);
			*x1 = maxdim;
		}
		return 1;
	}
	if (*x0 > maxdim) {
		/* start of line is right of window -
		complement of above */
		if (*x1 > maxdim)		/* as is the end, so the line misses the window */
			return 0;
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y0 += (int)(m * (maxdim - *x0));	/* adjust so point is on the right
							   boundary */
		*x0 = maxdim;
		/* now, perhaps, adjust the end of the line */
		if (*x1 < mindim) {
			*y1 -= (int)(m * (*x1 - mindim));
			*x1 = mindim;
		}
		return 1;
	}
	/* the final case - the start of the line is inside the window */
	if (*x1 > maxdim) {
		/* other end is outside to the right */
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y1 += (int)(m * (maxdim - *x1));
		*x1 = maxdim;
		return 1;
	}
	if (*x1 < mindim) {
		/* other end is outside to the left */
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y1 -= (int)(m * (*x1 - mindim));
		*x1 = mindim;
		return 1;
	}
	/* only get here if both points are inside the window */
	return 1;
}